

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_arith_meta(jit_State *J,TRef *sp,CType **s,CTState *cts,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  GCcdata *pGVar3;
  CType *ct_2;
  CTypeID id_1;
  CType *ct;
  cTValue *pcStack_120;
  CTypeID id;
  cTValue *tv;
  RecordFFData *rd_local;
  CTState *cts_local;
  CType **s_local;
  TRef *sp_local;
  jit_State *J_local;
  CType *local_e8;
  CType *ct_3;
  CType *local_d0;
  CType *ct_1;
  
  pcStack_120 = (cTValue *)0x0;
  if (*J->base != 0) {
    if ((int)(rd->argv->field_4).it >> 0xf == -0xb) {
      pGVar3 = argv2cdata(J,*J->base,rd->argv);
      ct._4_4_ = (uint)pGVar3->ctypeid;
      for (local_d0 = cts->tab + ct._4_4_; local_d0->info >> 0x1c == 8;
          local_d0 = cts->tab + (local_d0->info & 0xffff)) {
      }
      if (local_d0->info >> 0x1c == 2) {
        ct._4_4_ = local_d0->info & 0xffff;
      }
      pcStack_120 = lj_ctype_meta(cts,ct._4_4_,rd->data);
    }
    if (((pcStack_120 == (cTValue *)0x0) && (J->base[1] != 0)) &&
       ((int)rd->argv[1].field_4.it >> 0xf == -0xb)) {
      pGVar3 = argv2cdata(J,J->base[1],rd->argv + 1);
      ct_2._4_4_ = (uint)pGVar3->ctypeid;
      for (local_e8 = cts->tab + ct_2._4_4_; local_e8->info >> 0x1c == 8;
          local_e8 = cts->tab + (local_e8->info & 0xffff)) {
      }
      if (local_e8->info >> 0x1c == 2) {
        ct_2._4_4_ = local_e8->info & 0xffff;
      }
      pcStack_120 = lj_ctype_meta(cts,ct_2._4_4_,rd->data);
    }
  }
  if (pcStack_120 == (cTValue *)0x0) {
    if (rd->data != 4) goto LAB_001b7f28;
    if (((*sp == 0) || (sp[1] == 0)) || (((*s)->info >> 0x1c == 0) != (s[1]->info >> 0x1c == 0))) {
      J_local._4_4_ = 0x1007ffe;
    }
    else {
      TVar1 = *sp;
      TVar2 = sp[1];
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      J->postproc = LJ_POST_FIXGUARD;
      J_local._4_4_ = 0x2007ffd;
    }
  }
  else {
    if ((int)(pcStack_120->field_4).it >> 0xf != -9) {
LAB_001b7f28:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    crec_tailcall(J,rd,pcStack_120);
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

static TRef crec_arith_meta(jit_State *J, TRef *sp, CType **s, CTState *cts,
			    RecordFFData *rd)
{
  cTValue *tv = NULL;
  if (J->base[0]) {
    if (tviscdata(&rd->argv[0])) {
      CTypeID id = argv2cdata(J, J->base[0], &rd->argv[0])->ctypeid;
      CType *ct = ctype_raw(cts, id);
      if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
      tv = lj_ctype_meta(cts, id, (MMS)rd->data);
    }
    if (!tv && J->base[1] && tviscdata(&rd->argv[1])) {
      CTypeID id = argv2cdata(J, J->base[1], &rd->argv[1])->ctypeid;
      CType *ct = ctype_raw(cts, id);
      if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
      tv = lj_ctype_meta(cts, id, (MMS)rd->data);
    }
  }
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return 0;
    }  /* NYI: non-function metamethods. */
  } else if ((MMS)rd->data == MM_eq) {  /* Fallback cdata pointer comparison. */
    if (sp[0] && sp[1] && ctype_isnum(s[0]->info) == ctype_isnum(s[1]->info)) {
      /* Assume true comparison. Fixup and emit pending guard later. */
      lj_ir_set(J, IRTG(IR_EQ, IRT_PTR), sp[0], sp[1]);
      J->postproc = LJ_POST_FIXGUARD;
      return TREF_TRUE;
    } else {
      return TREF_FALSE;
    }
  }
  lj_trace_err(J, LJ_TRERR_BADTYPE);
  return 0;
}